

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall adios2::transport::FileStdio::FileStdio(FileStdio *this,Comm *comm)

{
  undefined8 *in_RDI;
  allocator local_69;
  Comm *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  Transport *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"File",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,"stdio",&local_69);
  Transport::Transport
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__FileStdio_01135128;
  in_RDI[0x1e] = 0;
  *(undefined1 *)(in_RDI + 0x1f) = 0;
  std::future<_IO_FILE_*>::future((future<_IO_FILE_*> *)0xd4f211);
  *(undefined1 *)(in_RDI + 0x22) = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  return;
}

Assistant:

FileStdio::FileStdio(helper::Comm const &comm) : Transport("File", "stdio", comm) {}